

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void print_statistics_csv(double *sketch_quantiles,double *exact_quantiles,int step)

{
  int p;
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  uVar1 = 0;
  dVar3 = 0.0;
  do {
    dVar2 = exact_quantiles[uVar1];
    if (dVar2 == 0.0) {
      dVar2 = 0.0;
    }
    else {
      dVar2 = ABS((sketch_quantiles[uVar1] - dVar2) / dVar2);
      dVar3 = dVar3 + dVar2;
    }
    if ((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % (long)step)
        == 0) {
      printf("%.10f,",dVar2);
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x65);
  printf("%.10f,",dVar3 / 101.0);
  return;
}

Assistant:

void print_statistics_csv(double *sketch_quantiles, double *exact_quantiles, int step){
    double avg_re = 0.0;
    for (int p = 0; p < 101; p++) {
        double re = 0.0;
        if (fabs(exact_quantiles[p]) > 0) {
            re = fabs((sketch_quantiles[p] - exact_quantiles[p])) / fabs(exact_quantiles[p]);
            avg_re += re;
        }
        if (!(p % step)) {
            printf("%.10f,", re);
        }
    }
    printf("%.10f,", avg_re/101.0);
}